

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_pixelformat.cpp
# Opt level: O1

char * get_format_name(ALLEGRO_BITMAP *bmp)

{
  int iVar1;
  long lVar2;
  
  if (bmp == (ALLEGRO_BITMAP *)0x0) {
    return "none";
  }
  iVar1 = al_get_bitmap_format();
  lVar2 = 8;
  do {
    if (*(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar2) == iVar1) {
      return *(char **)((long)&formats[0].format + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1f8);
  return "unknown";
}

Assistant:

const char *get_format_name(ALLEGRO_BITMAP *bmp)
{
   if (!bmp)
      return "none";

   int format = al_get_bitmap_format(bmp);
   for (unsigned i = 0; i < NUM_FORMATS; i++) {
      if (formats[i].format == format)
         return formats[i].name;
   }
   return "unknown";
}